

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O2

void __thiscall
Lib::DArray<Kernel::Literal*>::
sortGen<true,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>
          (DArray<Kernel::Literal*> *this,
          Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>
          *comp)

{
  Literal *l1;
  long lVar1;
  undefined8 uVar2;
  unsigned_long *puVar3;
  int iVar4;
  Comparison CVar5;
  Literal *aux;
  unsigned_long uVar6;
  ulong uVar7;
  unsigned_long s;
  ulong uVar8;
  ulong uVar9;
  long local_48;
  
  if (*(ulong *)this < 2) {
    return;
  }
  if ((sortGen<true,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>(Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>)
       ::ft == '\0') &&
     (iVar4 = __cxa_guard_acquire(&sortGen<true,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>(Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>)
                                   ::ft), iVar4 != 0)) {
    DArray<unsigned_long>::DArray
              (&DArray<Kernel::Literal_*>::
                sortGen<true,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
                ::ft,0x20);
    __cxa_atexit(DArray<unsigned_long>::~DArray,
                 &DArray<Kernel::Literal_*>::
                  sortGen<true,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
                  ::ft,&__dso_handle);
    __cxa_guard_release(&sortGen<true,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>(Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>)
                         ::ft);
  }
  s = *(long *)this - 1;
  DArray<unsigned_long>::ensure
            (&DArray<Kernel::Literal_*>::
              sortGen<true,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
              ::ft,s);
  local_48 = 0;
  uVar6 = 0;
LAB_00441beb:
  iVar4 = Random::getInteger(((int)s - (int)uVar6) + 1);
  l1 = *(Literal **)(*(long *)(this + 0x10) + ((long)iVar4 + uVar6) * 8);
  uVar7 = uVar6;
  uVar8 = s;
  uVar9 = (long)iVar4 + uVar6;
  while (uVar7 < uVar9) {
    CVar5 = Kernel::LiteralComparators::
            Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>
            ::compare(comp,*(Literal **)(*(long *)(this + 0x10) + uVar7 * 8),l1);
    if ((uint)CVar5 < 2) {
      uVar7 = uVar7 + 1;
    }
    else if (CVar5 == LESS) {
      lVar1 = *(long *)(this + 0x10);
      uVar2 = *(undefined8 *)(lVar1 + uVar7 * 8);
      if (uVar9 == uVar8) {
        *(undefined8 *)(lVar1 + uVar9 * 8) = uVar2;
        uVar8 = uVar9 - 1;
        *(undefined8 *)(*(long *)(this + 0x10) + uVar7 * 8) =
             *(undefined8 *)(*(long *)(this + 0x10) + -8 + uVar9 * 8);
        *(Literal **)(*(long *)(this + 0x10) + -8 + uVar9 * 8) = l1;
        uVar9 = uVar8;
      }
      else {
        *(undefined8 *)(lVar1 + uVar7 * 8) = *(undefined8 *)(lVar1 + uVar8 * 8);
        *(undefined8 *)(*(long *)(this + 0x10) + uVar8 * 8) = uVar2;
        uVar8 = uVar8 - 1;
      }
    }
  }
  do {
    uVar7 = uVar9 + 1;
    while( true ) {
      puVar3 = DArray<Kernel::Literal_*>::
               sortGen<true,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
               ::ft._array;
      if (uVar8 <= uVar9) {
        if (uVar7 < s) {
          DArray<Kernel::Literal_*>::
          sortGen<true,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
          ::ft._array[local_48] = uVar7;
          puVar3[local_48 + 1] = s;
          local_48 = local_48 + 2;
        }
        s = uVar9 - 1;
        if ((uVar9 == 0) || (s <= uVar6)) {
          if (local_48 == 0) {
            return;
          }
          uVar6 = DArray<Kernel::Literal_*>::
                  sortGen<true,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
                  ::ft._array[local_48 + -2];
          s = DArray<Kernel::Literal_*>::
              sortGen<true,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
              ::ft._array[local_48 + -1];
          local_48 = local_48 + -2;
        }
        goto LAB_00441beb;
      }
      CVar5 = Kernel::LiteralComparators::
              Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>
              ::compare(comp,l1,*(Literal **)(*(long *)(this + 0x10) + uVar7 * 8));
      if ((uint)(CVar5 + GREATER) < 2) break;
      if (CVar5 == GREATER) {
        lVar1 = *(long *)(this + 0x10);
        uVar2 = *(undefined8 *)(lVar1 + uVar8 * 8);
        *(undefined8 *)(lVar1 + uVar8 * 8) = *(undefined8 *)(lVar1 + uVar7 * 8);
        *(undefined8 *)(*(long *)(this + 0x10) + uVar7 * 8) = uVar2;
        uVar8 = uVar8 - 1;
      }
    }
    *(undefined8 *)(*(long *)(this + 0x10) + uVar9 * 8) =
         *(undefined8 *)(*(long *)(this + 0x10) + uVar7 * 8);
    *(Literal **)(*(long *)(this + 0x10) + uVar7 * 8) = l1;
    uVar9 = uVar7;
  } while( true );
}

Assistant:

void sortGen(Comparator comp)
  {
    if(_size <= 1) {
      return;
    }

    // array behaves as a stack of calls to quicksort
    static DArray<size_t> ft(32);

    size_t from = 0;
    size_t to=size()-1;
    ft.ensure(to);

    size_t p = 0; // pointer to the next element in ft
    for (;;) {
      ASS(from<size() && to<size()); //checking for underflows
      ASS(from<to);
      // invariant: from < to
      size_t m = from + Random::getInteger(to-from+1);
      C mid = (*this)[m];
      size_t l = from;
      size_t r = to;
      while (l < m) {
        switch ((Inversed?-1:1)*comp.compare((*this)[l],mid))
  	{
  	case EQUAL:
  	case LESS:
  	  l++;
  	  break;
  	case GREATER:
  	  if (m == r) {
  	    (*this)[m] = (*this)[l];
  	    (*this)[l] = (*this)[m-1];
  	    (*this)[m-1] = mid;
  	    m--;
  	    r--;
  	  }
  	  else {
  	    ASS(m < r);
  	    C aux = (*this)[l];
  	    (*this)[l] = (*this)[r];
  	    (*this)[r] = aux;
  	    r--;
  	  }
  	  break;
  	}
      }
      // l == m
      // now literals in lits[from ... m-1] are smaller than lits[m]
      // and literals in lits[r+1 ... to] are greater than lits[m]
      while (m < r) {
        switch ((Inversed?-1:1)*comp.compare(mid,(*this)[m+1]))
  	{
  	case LESS:
  	  {
  	    C aux = (*this)[r];
  	    (*this)[r] = (*this)[m+1];
  	    (*this)[m+1] = aux;
  	    r--;
  	  }
  	  break;
  	case EQUAL:
  	case GREATER:
  	  (*this)[m] = (*this)[m+1];
  	  (*this)[m+1] = mid;
  	  m++;
  	}
      }
      // now literals in lits[from ... m-1] are smaller than lits[m]
      // and all literals in lits[m+1 ... to] are greater than lits[m]
      if (m+1 < to) {
        ft[p++] = m+1;
        ft[p++] = to;
      }

      to = m-1;
      if (m!=0 && from < to) {
        continue;
      }
      if (p != 0) {
        p -= 2;
        ASS(p >= 0);
        from = ft[p];
        to = ft[p+1];
        continue;
      }
      return;
    }
  }